

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
* InferTaprootTree(optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                   *__return_storage_ptr__,TaprootSpendData *spenddata,XOnlyPubKey *output)

{
  uint256 *this;
  pointer ppTVar1;
  uchar *puVar2;
  uint uVar3;
  long lVar4;
  __uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_> _Var5;
  TreeNode *pTVar6;
  bool bVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  TreeNode *pTVar12;
  uint256 *merkle_root;
  long lVar13;
  unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *this_00;
  TreeNode *pTVar14;
  unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *puVar15;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script;
  Span<const_unsigned_char> control;
  Span<const_unsigned_char> a;
  Span<const_unsigned_char> b;
  unique_ptr<TreeNode,_std::default_delete<TreeNode>_> local_130;
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ret;
  uint256 hash;
  vector<TreeNode_*,_std::allocator<TreeNode_*>_> stack;
  uint256 leaf_hash;
  TreeNode local_a8;
  optional<std::pair<XOnlyPubKey,_bool>_> tweak;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this = &spenddata->merkle_root;
  bVar7 = base_blob<256U>::IsNull(&this->super_base_blob<256U>);
  merkle_root = (uint256 *)0x0;
  if (!bVar7) {
    merkle_root = this;
  }
  XOnlyPubKey::CreateTapTweak(&tweak,&spenddata->internal_key,merkle_root);
  if ((tweak.super__Optional_base<std::pair<XOnlyPubKey,_bool>,_true,_true>._M_payload.
       super__Optional_payload_base<std::pair<XOnlyPubKey,_bool>_>._M_engaged != true) ||
     (bVar7 = operator!=((base_blob<256U> *)&tweak,(base_blob<256U> *)output), bVar7)) {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
    ._M_engaged = false;
  }
  else {
    ret.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ret.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ret.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar7 = base_blob<256U>::IsNull(&this->super_base_blob<256U>);
    if (bVar7) {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ._M_impl = ret.
                   super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 8) =
           ret.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 0x10) =
           ret.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ret.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ret.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ret.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
      ._M_engaged = true;
    }
    else {
      local_a8.done = false;
      local_a8.sub[0]._M_t.super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
      super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl =
           (__uniq_ptr_data<TreeNode,_std::default_delete<TreeNode>,_true,_true>)
           (__uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>)0x0;
      local_a8.sub[1]._M_t.super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
      super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl._0_1_ = 0;
      local_a8.sub[1]._M_t.super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
      super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
      super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl._1_7_ = 0;
      local_a8.leaf._0_1_ = 0;
      local_a8._49_8_ = 0;
      local_a8.hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(this->super_base_blob<256U>).m_data._M_elems;
      local_a8.hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 8);
      local_a8.hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10);
      local_a8.hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18);
      for (p_Var10 = (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != &(spenddata->scripts)._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        p_Var8 = p_Var10[2]._M_right;
        while( true ) {
          if (p_Var8 == (_Base_ptr)&p_Var10[2]._M_parent) break;
          uVar3 = *(uint *)&p_Var10[1]._M_right;
          if ((uVar3 & 0xffffff01) == 0) {
            lVar13 = (long)p_Var8[1]._M_parent - (long)*(byte **)(p_Var8 + 1);
            if (((0xffffffffffffeffe < lVar13 - 0x1022U) && (((int)lVar13 - 1U & 0x1f) == 0)) &&
               (uVar3 == (**(byte **)(p_Var8 + 1) & 0xfffffffe))) {
              script.m_size = (long)p_Var10[1]._M_parent - (long)*(uchar **)(p_Var10 + 1);
              script.m_data = *(uchar **)(p_Var10 + 1);
              ComputeTapleafHash(&leaf_hash,(uint8_t)uVar3,script);
              control.m_size = (long)p_Var8[1]._M_parent - (long)*(uchar **)(p_Var8 + 1);
              control.m_data = *(uchar **)(p_Var8 + 1);
              ComputeTaprootMerkleRoot((uint256 *)&stack,control,&leaf_hash);
              bVar7 = operator!=((base_blob<256U> *)&stack,&this->super_base_blob<256U>);
              if (!bVar7) {
                uVar11 = (ulong)((long)p_Var8[1]._M_parent + (-0x21 - *(long *)(p_Var8 + 1))) >> 5;
                pTVar14 = &local_a8;
                for (uVar9 = 0; uVar9 != uVar11; uVar9 = uVar9 + 1) {
                  if ((pTVar14->explored == true) && (pTVar14->inner == false)) goto LAB_001a6473;
                  lVar13 = (~uVar9 + uVar11) * 0x20;
                  puVar2 = (uchar *)(*(long *)(p_Var8 + 1) + 0x21 + lVar13);
                  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)puVar2;
                  hash.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 8);
                  puVar2 = (uchar *)(*(long *)(p_Var8 + 1) + 0x31 + lVar13);
                  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar2;
                  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 8);
                  this_00 = pTVar14->sub;
                  if ((_Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>)
                      pTVar14->sub[0]._M_t.
                      super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t ==
                      (_Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>)0x0) {
                    pTVar14->explored = true;
                    pTVar14->inner = true;
                    std::
                    make_unique<InferTaprootTree(TaprootSpendData_const&,XOnlyPubKey_const&)::TreeNode>
                              ();
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator=
                              (this_00,&local_130);
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::~unique_ptr
                              (&local_130);
                    std::
                    make_unique<InferTaprootTree(TaprootSpendData_const&,XOnlyPubKey_const&)::TreeNode>
                              ();
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator=
                              (pTVar14->sub + 1,&local_130);
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::~unique_ptr
                              (&local_130);
                    _Var5._M_t.super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                    super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl =
                         pTVar14->sub[1]._M_t.
                         super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t;
                    *(undefined8 *)
                     ((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                            super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl + 0x10) =
                         hash.super_base_blob<256U>.m_data._M_elems._16_8_;
                    *(undefined8 *)
                     ((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                            super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl + 0x18) =
                         hash.super_base_blob<256U>.m_data._M_elems._24_8_;
                    *(undefined8 *)
                     _Var5._M_t.super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                     super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl =
                         hash.super_base_blob<256U>.m_data._M_elems._0_8_;
                    *(undefined8 *)
                     ((long)_Var5._M_t.
                            super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                            super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl + 8) =
                         hash.super_base_blob<256U>.m_data._M_elems._8_8_;
                  }
                  else {
                    puVar15 = pTVar14->sub + 1;
                    lVar13 = 0;
                    while( true ) {
                      if (lVar13 == 2) goto LAB_001a6473;
                      bVar7 = operator==((base_blob<256U> *)
                                         this_00[lVar13]._M_t.
                                         super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>
                                         .super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl,
                                         &hash.super_base_blob<256U>);
                      if ((bVar7) ||
                         ((bVar7 = base_blob<256U>::IsNull
                                             ((base_blob<256U> *)
                                              this_00[lVar13]._M_t.
                                              super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>
                                              .super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl
                                             ), bVar7 &&
                          (bVar7 = operator!=((base_blob<256U> *)
                                              (puVar15->_M_t).
                                              super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>
                                              ._M_t,&hash.super_base_blob<256U>), bVar7)))) break;
                      lVar13 = lVar13 + 1;
                      puVar15 = puVar15 + -1;
                    }
                    pTVar14 = this_00[lVar13]._M_t.
                              super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                              super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                              super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
                    *(undefined8 *)((long)&(pTVar14->hash).super_base_blob<256U> + 0x10) =
                         hash.super_base_blob<256U>.m_data._M_elems._16_8_;
                    *(undefined8 *)((long)&(pTVar14->hash).super_base_blob<256U> + 0x18) =
                         hash.super_base_blob<256U>.m_data._M_elems._24_8_;
                    *(undefined8 *)&(pTVar14->hash).super_base_blob<256U> =
                         hash.super_base_blob<256U>.m_data._M_elems._0_8_;
                    *(undefined8 *)((long)&(pTVar14->hash).super_base_blob<256U> + 8) =
                         hash.super_base_blob<256U>.m_data._M_elems._8_8_;
                    this_00 = this_00 + (1 - (int)lVar13);
                  }
                  pTVar14 = (this_00->_M_t).
                            super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                            super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                            super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
                }
                if ((_Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>)
                    pTVar14->sub[0]._M_t.
                    super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t !=
                    (_Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>)0x0) {
LAB_001a6473:
                  (__return_storage_ptr__->
                  super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                  ._M_engaged = false;
                  goto LAB_001a647d;
                }
                pTVar14->explored = true;
                pTVar14->inner = false;
                pTVar14->leaf =
                     (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                     (p_Var10 + 1);
                *(undefined8 *)&(pTVar14->hash).super_base_blob<256U>.m_data =
                     leaf_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
                *(undefined8 *)((long)&(pTVar14->hash).super_base_blob<256U>.m_data + 8) =
                     leaf_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
                *(undefined8 *)((long)&(pTVar14->hash).super_base_blob<256U>.m_data + 0x10) =
                     leaf_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
                *(undefined8 *)((long)&(pTVar14->hash).super_base_blob<256U>.m_data + 0x18) =
                     leaf_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
              }
            }
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        }
      }
      stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(8);
      stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      *stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
       super__Vector_impl_data._M_start = &local_a8;
      stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
LAB_001a6510:
      if (stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar14 = stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
        if (pTVar14->explored != true) {
          bVar7 = false;
          goto LAB_001a664e;
        }
        ppTVar1 = stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
        if (pTVar14->inner == false) {
          leaf_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               ((long)stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) + -1;
          std::
          vector<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::allocator<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>>
          ::
          emplace_back<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,int_const&>
                    ((vector<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::allocator<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>>
                      *)&ret,(unsigned_long *)&leaf_hash.super_base_blob<256U>,&pTVar14->leaf->first
                     ,&pTVar14->leaf->second);
LAB_001a6583:
          pTVar14->done = true;
          stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppTVar1;
        }
        else {
          pTVar12 = pTVar14->sub[0]._M_t.
                    super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                    super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                    super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
          if (((pTVar12->done == true) &&
              (pTVar6 = pTVar14->sub[1]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl, pTVar6->done == false
              )) && (pTVar6->explored == false)) {
            bVar7 = base_blob<256U>::IsNull((base_blob<256U> *)pTVar6);
            if (bVar7) {
              pTVar12 = pTVar14->sub[0]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
            }
            else {
              pTVar12 = pTVar14->sub[1]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
              a.m_size = 0x20;
              a.m_data = (uchar *)pTVar12;
              b.m_size = 0x20;
              b.m_data = (uchar *)pTVar12;
              ComputeTapbranchHash((uint256 *)&leaf_hash.super_base_blob<256U>,a,b);
              bVar7 = operator==(&leaf_hash.super_base_blob<256U>,(base_blob<256U> *)pTVar14);
              pTVar12 = pTVar14->sub[0]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
              if (bVar7) {
                pTVar12->done = false;
                (pTVar14->sub[1]._M_t.
                 super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                 super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                 super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl)->done = true;
                goto LAB_001a6510;
              }
            }
          }
          if (pTVar12->done == true) {
            pTVar6 = pTVar14->sub[1]._M_t.
                     super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                     super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                     super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
            if (pTVar6->done == true) {
              pTVar12->done = false;
              pTVar6->done = false;
              goto LAB_001a6583;
            }
            leaf_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pTVar6;
            std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                      (&stack,(value_type *)&leaf_hash.super_base_blob<256U>);
          }
          else {
            leaf_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pTVar12;
            std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                      (&stack,(value_type *)&leaf_hash.super_base_blob<256U>);
          }
        }
        goto LAB_001a6510;
      }
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
        ._M_impl = ret.
                   super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 8) =
           ret.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_payload._M_value.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl + 0x10) =
           ret.
           super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ret.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ret.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ret.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar7 = true;
LAB_001a664e:
      (__return_storage_ptr__->
      super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
      ._M_engaged = bVar7;
      std::_Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>::~_Vector_base
                (&stack.super__Vector_base<TreeNode_*,_std::allocator<TreeNode_*>_>);
LAB_001a647d:
      InferTaprootTree::TreeNode::~TreeNode(&local_a8);
    }
    std::
    vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ::~vector(&ret);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<std::tuple<int, std::vector<unsigned char>, int>>> InferTaprootTree(const TaprootSpendData& spenddata, const XOnlyPubKey& output)
{
    // Verify that the output matches the assumed Merkle root and internal key.
    auto tweak = spenddata.internal_key.CreateTapTweak(spenddata.merkle_root.IsNull() ? nullptr : &spenddata.merkle_root);
    if (!tweak || tweak->first != output) return std::nullopt;
    // If the Merkle root is 0, the tree is empty, and we're done.
    std::vector<std::tuple<int, std::vector<unsigned char>, int>> ret;
    if (spenddata.merkle_root.IsNull()) return ret;

    /** Data structure to represent the nodes of the tree we're going to build. */
    struct TreeNode {
        /** Hash of this node, if known; 0 otherwise. */
        uint256 hash;
        /** The left and right subtrees (note that their order is irrelevant). */
        std::unique_ptr<TreeNode> sub[2];
        /** If this is known to be a leaf node, a pointer to the (script, leaf_ver) pair.
         *  nullptr otherwise. */
        const std::pair<std::vector<unsigned char>, int>* leaf = nullptr;
        /** Whether or not this node has been explored (is known to be a leaf, or known to have children). */
        bool explored = false;
        /** Whether or not this node is an inner node (unknown until explored = true). */
        bool inner;
        /** Whether or not we have produced output for this subtree. */
        bool done = false;
    };

    // Build tree from the provided branches.
    TreeNode root;
    root.hash = spenddata.merkle_root;
    for (const auto& [key, control_blocks] : spenddata.scripts) {
        const auto& [script, leaf_ver] = key;
        for (const auto& control : control_blocks) {
            // Skip script records with nonsensical leaf version.
            if (leaf_ver < 0 || leaf_ver >= 0x100 || leaf_ver & 1) continue;
            // Skip script records with invalid control block sizes.
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE ||
                ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) continue;
            // Skip script records that don't match the control block.
            if ((control[0] & TAPROOT_LEAF_MASK) != leaf_ver) continue;
            // Skip script records that don't match the provided Merkle root.
            const uint256 leaf_hash = ComputeTapleafHash(leaf_ver, script);
            const uint256 merkle_root = ComputeTaprootMerkleRoot(control, leaf_hash);
            if (merkle_root != spenddata.merkle_root) continue;

            TreeNode* node = &root;
            size_t levels = (control.size() - TAPROOT_CONTROL_BASE_SIZE) / TAPROOT_CONTROL_NODE_SIZE;
            for (size_t depth = 0; depth < levels; ++depth) {
                // Can't descend into a node which we already know is a leaf.
                if (node->explored && !node->inner) return std::nullopt;

                // Extract partner hash from Merkle branch in control block.
                uint256 hash;
                std::copy(control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - 1 - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          hash.begin());

                if (node->sub[0]) {
                    // Descend into the existing left or right branch.
                    bool desc = false;
                    for (int i = 0; i < 2; ++i) {
                        if (node->sub[i]->hash == hash || (node->sub[i]->hash.IsNull() && node->sub[1-i]->hash != hash)) {
                            node->sub[i]->hash = hash;
                            node = &*node->sub[1-i];
                            desc = true;
                            break;
                        }
                    }
                    if (!desc) return std::nullopt; // This probably requires a hash collision to hit.
                } else {
                    // We're in an unexplored node. Create subtrees and descend.
                    node->explored = true;
                    node->inner = true;
                    node->sub[0] = std::make_unique<TreeNode>();
                    node->sub[1] = std::make_unique<TreeNode>();
                    node->sub[1]->hash = hash;
                    node = &*node->sub[0];
                }
            }
            // Cannot turn a known inner node into a leaf.
            if (node->sub[0]) return std::nullopt;
            node->explored = true;
            node->inner = false;
            node->leaf = &key;
            node->hash = leaf_hash;
        }
    }

    // Recursive processing to turn the tree into flattened output. Use an explicit stack here to avoid
    // overflowing the call stack (the tree may be 128 levels deep).
    std::vector<TreeNode*> stack{&root};
    while (!stack.empty()) {
        TreeNode& node = *stack.back();
        if (!node.explored) {
            // Unexplored node, which means the tree is incomplete.
            return std::nullopt;
        } else if (!node.inner) {
            // Leaf node; produce output.
            ret.emplace_back(stack.size() - 1, node.leaf->first, node.leaf->second);
            node.done = true;
            stack.pop_back();
        } else if (node.sub[0]->done && !node.sub[1]->done && !node.sub[1]->explored && !node.sub[1]->hash.IsNull() &&
                   ComputeTapbranchHash(node.sub[1]->hash, node.sub[1]->hash) == node.hash) {
            // Whenever there are nodes with two identical subtrees under it, we run into a problem:
            // the control blocks for the leaves underneath those will be identical as well, and thus
            // they will all be matched to the same path in the tree. The result is that at the location
            // where the duplicate occurred, the left child will contain a normal tree that can be explored
            // and processed, but the right one will remain unexplored.
            //
            // This situation can be detected, by encountering an inner node with unexplored right subtree
            // with known hash, and H_TapBranch(hash, hash) is equal to the parent node (this node)'s hash.
            //
            // To deal with this, simply process the left tree a second time (set its done flag to false;
            // noting that the done flag of its children have already been set to false after processing
            // those). To avoid ending up in an infinite loop, set the done flag of the right (unexplored)
            // subtree to true.
            node.sub[0]->done = false;
            node.sub[1]->done = true;
        } else if (node.sub[0]->done && node.sub[1]->done) {
            // An internal node which we're finished with.
            node.sub[0]->done = false;
            node.sub[1]->done = false;
            node.done = true;
            stack.pop_back();
        } else if (!node.sub[0]->done) {
            // An internal node whose left branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[0]);
        } else if (!node.sub[1]->done) {
            // An internal node whose right branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[1]);
        }
    }

    return ret;
}